

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::InitFrom(Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
           *this,Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                 *other)

{
  ulong uVar1;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> construct_first;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> requested_capacity;
  ulong uVar2;
  Allocated AVar3;
  anon_class_1_0_00000001 local_21;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_const_absl::lts_20250127::status_internal::Payload_*>
  values;
  
  uVar2 = (other->metadata_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
          .super_Storage<unsigned_long,_1UL,_false>.value;
  uVar1 = uVar2;
  if (uVar2 < 2) {
    InitFrom::anon_class_1_0_00000001::operator()(&local_21);
    uVar1 = (other->metadata_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
            .super_Storage<unsigned_long,_1UL,_false>.value;
  }
  uVar2 = uVar2 >> 1;
  if ((uVar1 & 1) == 0) {
    construct_first =
         (Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)&this->data_;
    values.it_ = (Payload *)&other->data_;
  }
  else {
    requested_capacity = 2;
    if (2 < uVar2) {
      requested_capacity = uVar2;
    }
    AVar3 = (Allocated)
            MallocAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_false>::
            Allocate((allocator<absl::lts_20250127::status_internal::Payload> *)this,
                     requested_capacity);
    construct_first = AVar3.allocated_data;
    (this->data_).allocated = AVar3;
    values.it_ = (other->data_).allocated.allocated_data;
  }
  ConstructElements<std::allocator<absl::lts_20250127::status_internal::Payload>,absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,absl::lts_20250127::status_internal::Payload_const*>>
            ((type_identity_t<std::allocator<absl::lts_20250127::status_internal::Payload>_> *)this,
             construct_first,&values,uVar2);
  (this->metadata_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_1UL,_false>.value =
       (other->metadata_).
       super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<std::allocator<absl::lts_20250127::status_internal::Payload>,_unsigned_long>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
       .super_Storage<unsigned_long,_1UL,_false>.value;
  return;
}

Assistant:

void Storage<T, N, A>::InitFrom(const Storage& other) {
  const SizeType<A> n = other.GetSize();
  ABSL_HARDENING_ASSERT(n > 0);  // Empty sources handled handled in caller.
  ConstPointer<A> src;
  Pointer<A> dst;
  if (!other.GetIsAllocated()) {
    dst = GetInlinedData();
    src = other.GetInlinedData();
  } else {
    // Because this is only called from the `InlinedVector` constructors, it's
    // safe to take on the allocation with size `0`. If `ConstructElements(...)`
    // throws, deallocation will be automatically handled by `~Storage()`.
    SizeType<A> requested_capacity = ComputeCapacity(GetInlinedCapacity(), n);
    Allocation<A> allocation =
        MallocAdapter<A>::Allocate(GetAllocator(), requested_capacity);
    SetAllocation(allocation);
    dst = allocation.data;
    src = other.GetAllocatedData();
  }

  // Fast path: if the value type is trivially copy constructible and we know
  // the allocator doesn't do anything fancy, then we know it is legal for us to
  // simply memcpy the other vector's elements.
  if (absl::is_trivially_copy_constructible<ValueType<A>>::value &&
      std::is_same<A, std::allocator<ValueType<A>>>::value) {
    std::memcpy(reinterpret_cast<char*>(dst),
                reinterpret_cast<const char*>(src), n * sizeof(ValueType<A>));
  } else {
    auto values = IteratorValueAdapter<A, ConstPointer<A>>(src);
    ConstructElements<A>(GetAllocator(), dst, values, n);
  }

  GetSizeAndIsAllocated() = other.GetSizeAndIsAllocated();
}